

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O3

sat_solver *
Bmc_DeriveSolver(Gia_Man_t *p,Gia_Man_t *pMiter,Cnf_Dat_t *pCnf,int nFramesMax,int nTimeOut,
                int fVerbose)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  sat_solver *psVar5;
  int iVar6;
  int iVar7;
  sat_solver *s;
  lit *plVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  abctime aVar11;
  ulong uVar12;
  Cnf_Dat_t *pCVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  timespec ts;
  timespec local_a8;
  lit local_98 [2];
  Gia_Man_t *local_90;
  int local_88;
  int local_84;
  Cnf_Dat_t *local_80;
  Vec_Int_t *local_78;
  int local_6c;
  ulong local_68;
  int local_5c;
  sat_solver *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Gia_Man_t *local_38;
  
  s = sat_solver_new();
  local_90 = p;
  local_40 = (ulong)(uint)nFramesMax;
  sat_solver_setnvars(s,(nFramesMax + 1) * pCnf->nVars + p->vCos->nSize + p->nRegs);
  if (nTimeOut == 0) {
    aVar11 = 0;
  }
  else {
    iVar6 = clock_gettime(3,&local_a8);
    if (iVar6 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = CONCAT44(local_a8.tv_nsec._4_4_,(int)local_a8.tv_nsec) / 1000 +
               CONCAT44(local_a8.tv_sec._4_4_,(uint)local_a8.tv_sec) * 1000000;
    }
    aVar11 = lVar10 + (long)nTimeOut * 1000000;
  }
  s->nRuntimeLimit = aVar11;
  pVVar9 = local_90->vCos;
  iVar6 = pVVar9->nSize;
  local_78 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar7 = iVar6;
  }
  local_78->nSize = 0;
  local_78->nCap = iVar7;
  if (iVar7 == 0) {
    plVar8 = (lit *)0x0;
  }
  else {
    plVar8 = (lit *)malloc((long)iVar7 << 2);
  }
  pGVar4 = local_90;
  local_78->pArray = plVar8;
  if (iVar6 < 1) {
    lVar10 = 0;
  }
  else {
    lVar10 = 0;
    do {
      if ((pVVar9->pArray[lVar10] < 0) || (pGVar4->nObjs <= pVVar9->pArray[lVar10]))
      goto LAB_00521c88;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      iVar6 = pGVar4->nRegs + (int)lVar10;
      if (iVar6 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(local_78,iVar6 * 2);
      lVar10 = lVar10 + 1;
      pVVar9 = pGVar4->vCos;
    } while (lVar10 < pVVar9->nSize);
    plVar8 = local_78->pArray;
    lVar10 = (long)local_78->nSize;
  }
  sat_solver_addclause(s,plVar8,plVar8 + lVar10);
  pVVar9 = local_90->vCos;
  iVar7 = pVVar9->nSize + local_90->nRegs;
  iVar6 = pMiter->nObjs;
  if ((0 < iVar6) && (pMiter->pObjs != (Gia_Obj_t *)0x0)) {
    piVar3 = pCnf->pVarNums;
    lVar10 = 0;
    do {
      iVar15 = piVar3[lVar10];
      if (-1 < iVar15) {
        piVar3[lVar10] = iVar15 + iVar7;
        iVar6 = pMiter->nObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar6);
  }
  if (0 < pCnf->nLiterals) {
    piVar3 = *pCnf->pClauses;
    lVar10 = 0;
    do {
      piVar3[lVar10] = piVar3[lVar10] + iVar7 * 2;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pCnf->nLiterals);
  }
  local_5c = local_90->nRegs;
  iVar6 = pVVar9->nSize;
  local_88 = iVar6;
  iVar7 = local_5c;
  if (local_5c < iVar6) {
    uVar12 = 0;
    plVar8 = (lit *)((long)&local_a8.tv_nsec + 4);
    uVar19 = 0;
    do {
      if ((long)iVar6 <= (long)uVar19) goto LAB_00521ca7;
      if ((pVVar9->pArray[uVar19] < 0) || (local_90->nObjs <= pVVar9->pArray[uVar19]))
      goto LAB_00521c88;
      if (local_90->pObjs == (Gia_Obj_t *)0x0) break;
      iVar6 = pMiter->vCos->nSize;
      iVar15 = iVar6 - pMiter->nRegs;
      iVar18 = (int)uVar12;
      if (iVar15 <= iVar18) {
LAB_00521d04:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (iVar6 <= iVar18) goto LAB_00521ca7;
      piVar3 = pMiter->vCos->pArray;
      iVar1 = piVar3[uVar19 * 2];
      if (((long)iVar1 < 0) || (pMiter->nObjs <= iVar1)) goto LAB_00521c88;
      if (iVar15 <= iVar18 + 1) goto LAB_00521d04;
      if (iVar6 <= iVar18 + 1) goto LAB_00521ca7;
      uVar16 = piVar3[uVar19 * 2 + 1];
      if (((long)(int)uVar16 < 0) || ((uint)pMiter->nObjs <= uVar16)) goto LAB_00521c88;
      uVar17 = pCnf->pVarNums[iVar1];
      uVar16 = pCnf->pVarNums[(int)uVar16];
      uVar14 = iVar7 + (int)uVar19;
      local_50 = uVar19;
      local_48 = uVar12;
      if ((int)(uVar14 | uVar17 | uVar16) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x174,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_sec._0_4_ = uVar17 * 2 + 1;
      local_80 = (Cnf_Dat_t *)CONCAT44(local_80._4_4_,(uint)local_a8.tv_sec);
      local_a8.tv_sec._4_4_ = uVar16 * 2 + 1;
      local_a8.tv_nsec._0_4_ = uVar14 * 2 + 1;
      local_84 = local_a8.tv_sec._4_4_;
      local_6c = (int)local_a8.tv_nsec;
      local_68 = (ulong)uVar17;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,plVar8);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x17a,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_sec._0_4_ = local_80._0_4_;
      local_a8.tv_sec._4_4_ = uVar16 * 2;
      local_a8.tv_nsec._0_4_ = uVar14 * 2;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,plVar8);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x180,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      uVar17 = (int)local_68 * 2;
      local_a8.tv_sec._4_4_ = local_84;
      local_a8.tv_sec._0_4_ = uVar17;
      local_a8.tv_nsec._0_4_ = uVar14 * 2;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,plVar8);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x186,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_nsec._0_4_ = local_6c;
      local_a8.tv_sec._0_4_ = uVar17;
      local_a8.tv_sec._4_4_ = uVar16 * 2;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,plVar8);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x18c,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      uVar19 = local_50 + 1;
      iVar7 = local_90->nRegs;
      pVVar9 = local_90->vCos;
      iVar6 = pVVar9->nSize;
      uVar12 = (ulong)((int)local_48 + 2);
    } while ((long)uVar19 < (long)(iVar6 - iVar7));
  }
  if (0 < iVar7) {
    uVar12 = 0;
    pCVar13 = (Cnf_Dat_t *)0x1;
LAB_005214bd:
    plVar8 = (lit *)((long)&local_a8.tv_nsec + 4);
    iVar6 = local_90->vCos->nSize;
    iVar15 = (int)uVar12;
    uVar17 = iVar15 + iVar6;
    uVar19 = (ulong)uVar17;
    uVar16 = uVar17 - iVar7;
    if (((int)uVar16 < 0) || (iVar6 <= (int)uVar16)) {
LAB_00521ca7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar6 = local_90->vCos->pArray[uVar16];
    if ((iVar6 < 0) || (local_90->nObjs <= iVar6)) {
LAB_00521c88:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (local_90->pObjs != (Gia_Obj_t *)0x0) {
      iVar6 = pMiter->nRegs;
      if (iVar6 <= iVar15) {
LAB_00521ce5:
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a9,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
      }
      iVar18 = pMiter->vCos->nSize;
      uVar16 = (iVar18 - iVar6) + iVar15;
      local_68 = uVar19;
      if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_00521ca7;
      piVar3 = pMiter->vCos->pArray;
      iVar1 = piVar3[uVar16];
      if (((long)iVar1 < 0) || (pMiter->nObjs <= iVar1)) goto LAB_00521c88;
      if (iVar6 <= iVar7 + iVar15) goto LAB_00521ce5;
      uVar16 = ((iVar7 + iVar18) - iVar6) + iVar15;
      if (iVar18 <= (int)uVar16) goto LAB_00521ca7;
      uVar16 = piVar3[uVar16];
      if (((long)(int)uVar16 < 0) || ((uint)pMiter->nObjs <= uVar16)) goto LAB_00521c88;
      uVar14 = pCnf->pVarNums[iVar1];
      uVar16 = pCnf->pVarNums[(int)uVar16];
      local_80 = pCVar13;
      local_50 = uVar12;
      if ((int)(uVar14 | uVar17 | uVar16) < 0) {
        __assert_fail("iVarF >= 0 && iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x202,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_sec._0_4_ = uVar17 * 2 + 1;
      local_a8.tv_sec._4_4_ = uVar14 * 2 + 1;
      local_48 = CONCAT44(local_48._4_4_,local_a8.tv_sec._4_4_);
      local_a8.tv_nsec._0_4_ = uVar16 * 2 + 1;
      local_84 = (uint)local_a8.tv_sec;
      local_6c = (int)local_a8.tv_nsec;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,plVar8);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x208,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_sec._0_4_ = local_84;
      local_a8.tv_sec._4_4_ = uVar14 * 2;
      local_a8.tv_nsec._0_4_ = uVar16 * 2;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,plVar8);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x20e,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_sec._0_4_ = local_84;
      local_a8.tv_sec._4_4_ = (int)local_80 + -1;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,(lit *)&local_a8.tv_nsec);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x213,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      uVar17 = (int)local_68 * 2;
      local_a8.tv_sec._4_4_ = (undefined4)local_48;
      local_a8.tv_nsec._4_4_ = (int)local_80;
      local_a8.tv_sec._0_4_ = uVar17;
      local_a8.tv_nsec._0_4_ = uVar16 * 2;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,local_98);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x21a,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_a8.tv_nsec._0_4_ = local_6c;
      iVar15 = (int)local_80;
      local_a8.tv_sec._0_4_ = uVar17;
      local_a8.tv_sec._4_4_ = uVar14 * 2;
      local_a8.tv_nsec._4_4_ = iVar15;
      iVar6 = sat_solver_addclause(s,(lit *)&local_a8,local_98);
      if (iVar6 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x221,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      uVar16 = (int)local_50 + 1;
      uVar12 = (ulong)uVar16;
      iVar7 = local_90->nRegs;
      pCVar13 = (Cnf_Dat_t *)(ulong)(iVar15 + 2);
      if ((int)uVar16 < iVar7) goto LAB_005214bd;
    }
  }
  local_88 = local_88 + local_5c;
  lVar10 = 0;
  while (lVar10 < pCnf->nClauses) {
    iVar6 = sat_solver_addclause(s,pCnf->pClauses[lVar10],pCnf->pClauses[lVar10 + 1]);
    lVar10 = lVar10 + 1;
    if (iVar6 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                    ,0x88,
                    "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                   );
    }
  }
  if (0 < (int)(uint)local_40) {
    uVar12 = 0;
    local_80 = pCnf;
    local_58 = s;
    local_38 = pMiter;
    do {
      local_78->nSize = 0;
      iVar6 = pMiter->nRegs;
      local_68 = uVar12;
      if (0 < iVar6) {
        iVar7 = 0;
        do {
          iVar15 = pMiter->vCis->nSize;
          uVar16 = (iVar15 - iVar6) + iVar7;
          if (((int)uVar16 < 0) || (iVar15 <= (int)uVar16)) goto LAB_00521ca7;
          iVar6 = pMiter->vCis->pArray[uVar16];
          if (((long)iVar6 < 0) || (pMiter->nObjs <= iVar6)) goto LAB_00521c88;
          if (pMiter->pObjs == (Gia_Obj_t *)0x0) {
            iVar6 = pCnf->nVars;
            goto LAB_005217f1;
          }
          Vec_IntPush(local_78,pCnf->pVarNums[iVar6]);
          iVar7 = iVar7 + 1;
          iVar6 = pMiter->nRegs;
        } while (iVar7 < iVar6);
      }
      iVar7 = pMiter->nObjs;
      iVar6 = pCnf->nVars;
      if ((0 < iVar7) && (pMiter->pObjs != (Gia_Obj_t *)0x0)) {
        piVar3 = pCnf->pVarNums;
        lVar10 = 0;
        do {
          iVar15 = piVar3[lVar10];
          if (-1 < iVar15) {
            piVar3[lVar10] = iVar15 + iVar6;
            iVar7 = pMiter->nObjs;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar7);
      }
LAB_005217f1:
      if (0 < pCnf->nLiterals) {
        piVar3 = *pCnf->pClauses;
        lVar10 = 0;
        do {
          piVar3[lVar10] = piVar3[lVar10] + iVar6 * 2;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pCnf->nLiterals);
      }
      local_88 = local_88 + pCnf->nVars;
      iVar6 = pMiter->nRegs;
      if (0 < iVar6) {
        lVar10 = 0;
        do {
          iVar7 = pMiter->vCos->nSize;
          uVar12 = (ulong)(uint)(iVar7 - iVar6) + lVar10;
          iVar15 = (int)uVar12;
          if ((iVar15 < 0) || (iVar7 <= iVar15)) goto LAB_00521ca7;
          iVar7 = pMiter->vCos->pArray[uVar12 & 0xffffffff];
          if (((long)iVar7 < 0) || (pMiter->nObjs <= iVar7)) goto LAB_00521c88;
          if (pMiter->pObjs == (Gia_Obj_t *)0x0) break;
          if (local_78->nSize <= lVar10) goto LAB_00521ca7;
          uVar16 = local_78->pArray[lVar10];
          if (uVar16 != 0xffffffff) {
            if ((int)(uVar16 | pCnf->pVarNums[iVar7]) < 0) goto LAB_00521d23;
            uVar17 = pCnf->pVarNums[iVar7] * 2;
            local_a8.tv_sec._4_4_ = uVar16 * 2 + 1;
            local_a8.tv_sec._0_4_ = uVar17;
            iVar6 = sat_solver_addclause(s,(lit *)&local_a8,(lit *)&local_a8.tv_nsec);
            if (iVar6 != 0) {
              local_a8.tv_sec._4_4_ = uVar16 * 2;
              local_a8.tv_sec._0_4_ = uVar17 | 1;
              sat_solver_addclause(local_58,(lit *)&local_a8,(lit *)&local_a8.tv_nsec);
            }
            iVar6 = pMiter->nRegs;
            s = local_58;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar6);
      }
      iVar7 = local_90->nRegs;
      pVVar9 = local_90->vCos;
      iVar6 = pVVar9->nSize;
      if (iVar7 < iVar6) {
        iVar15 = 0;
        lVar10 = 0;
        do {
          psVar5 = local_58;
          if (iVar6 <= lVar10) goto LAB_00521ca7;
          if ((pVVar9->pArray[lVar10] < 0) || (local_90->nObjs <= pVVar9->pArray[lVar10]))
          goto LAB_00521c88;
          if (local_90->pObjs == (Gia_Obj_t *)0x0) break;
          iVar6 = pMiter->vCos->nSize;
          iVar7 = iVar6 - pMiter->nRegs;
          if (iVar7 <= iVar15) goto LAB_00521d04;
          if (iVar6 <= iVar15) goto LAB_00521ca7;
          piVar3 = pMiter->vCos->pArray;
          iVar18 = piVar3[lVar10 * 2];
          if (((long)iVar18 < 0) || (pMiter->nObjs <= iVar18)) goto LAB_00521c88;
          if (iVar7 <= iVar15 + 1) goto LAB_00521d04;
          if (iVar6 <= iVar15 + 1) goto LAB_00521ca7;
          uVar16 = piVar3[lVar10 * 2 + 1];
          if (((long)(int)uVar16 < 0) || ((uint)pMiter->nObjs <= uVar16)) goto LAB_00521c88;
          uVar17 = pCnf->pVarNums[iVar18];
          uVar16 = pCnf->pVarNums[(int)uVar16];
          if ((int)(uVar16 | uVar17) < 0) {
LAB_00521d23:
            __assert_fail("iVarA >= 0 && iVarB >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x136,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
          }
          uVar17 = uVar17 * 2;
          local_a8.tv_sec._4_4_ = uVar16 * 2 + 1;
          local_a8.tv_sec._0_4_ = uVar17;
          iVar6 = sat_solver_addclause(local_58,(lit *)&local_a8,(lit *)&local_a8.tv_nsec);
          if (iVar6 != 0) {
            local_a8.tv_sec._4_4_ = uVar16 * 2;
            local_a8.tv_sec._0_4_ = uVar17 | 1;
            sat_solver_addclause(psVar5,(lit *)&local_a8,(lit *)&local_a8.tv_nsec);
          }
          lVar10 = lVar10 + 1;
          iVar7 = local_90->nRegs;
          pVVar9 = local_90->vCos;
          iVar6 = pVVar9->nSize;
          iVar15 = iVar15 + 2;
          pCnf = local_80;
          s = psVar5;
          pMiter = local_38;
        } while (lVar10 < iVar6 - iVar7);
      }
      if (0 < iVar7) {
        iVar6 = 0;
        iVar15 = 1;
        do {
          psVar5 = local_58;
          iVar18 = local_90->vCos->nSize;
          uVar16 = (iVar18 - iVar7) + iVar6;
          if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_00521ca7;
          iVar18 = local_90->vCos->pArray[uVar16];
          if ((iVar18 < 0) || (local_90->nObjs <= iVar18)) goto LAB_00521c88;
          if (local_90->pObjs == (Gia_Obj_t *)0x0) break;
          iVar18 = pMiter->nRegs;
          if (iVar18 <= iVar6) goto LAB_00521ce5;
          iVar1 = pMiter->vCos->nSize;
          uVar16 = (iVar1 - iVar18) + iVar6;
          if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) goto LAB_00521ca7;
          piVar3 = pMiter->vCos->pArray;
          iVar2 = piVar3[uVar16];
          if (((long)iVar2 < 0) || (pMiter->nObjs <= iVar2)) goto LAB_00521c88;
          if (iVar18 <= iVar7 + iVar6) goto LAB_00521ce5;
          uVar16 = ((iVar7 + iVar1) - iVar18) + iVar6;
          if (iVar1 <= (int)uVar16) goto LAB_00521ca7;
          uVar16 = piVar3[uVar16];
          if (((long)(int)uVar16 < 0) || ((uint)pMiter->nObjs <= uVar16)) goto LAB_00521c88;
          uVar17 = pCnf->pVarNums[iVar2];
          uVar16 = pCnf->pVarNums[(int)uVar16];
          if ((int)(uVar16 | uVar17) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x14b,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          uVar17 = uVar17 * 2;
          local_a8.tv_sec._4_4_ = uVar16 * 2 + 1;
          local_a8.tv_sec._0_4_ = uVar17;
          local_a8.tv_nsec._0_4_ = iVar15;
          iVar7 = sat_solver_addclause
                            (local_58,(lit *)&local_a8,(lit *)((long)&local_a8.tv_nsec + 4));
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x151,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          local_a8.tv_sec._4_4_ = uVar16 * 2;
          local_a8.tv_sec._0_4_ = uVar17 | 1;
          local_a8.tv_nsec._0_4_ = iVar15;
          iVar7 = sat_solver_addclause(psVar5,(lit *)&local_a8,(lit *)((long)&local_a8.tv_nsec + 4))
          ;
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x157,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          iVar6 = iVar6 + 1;
          iVar7 = local_90->nRegs;
          iVar15 = iVar15 + 2;
          pCnf = local_80;
          s = psVar5;
          pMiter = local_38;
        } while (iVar6 < iVar7);
      }
      lVar10 = 0;
      while (lVar10 < pCnf->nClauses) {
        iVar6 = sat_solver_addclause(s,pCnf->pClauses[lVar10],pCnf->pClauses[lVar10 + 1]);
        lVar10 = lVar10 + 1;
        if (iVar6 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                        ,0xb1,
                        "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                       );
        }
      }
      uVar16 = (int)local_68 + 1;
      uVar12 = (ulong)uVar16;
    } while (uVar16 != (uint)local_40);
  }
  iVar6 = pMiter->nObjs;
  if ((0 < iVar6) && (pMiter->pObjs != (Gia_Obj_t *)0x0)) {
    piVar3 = pCnf->pVarNums;
    lVar10 = 0;
    do {
      iVar7 = piVar3[lVar10];
      if (-1 < iVar7) {
        piVar3[lVar10] = iVar7 - local_88;
        iVar6 = pMiter->nObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar6);
  }
  if (0 < pCnf->nLiterals) {
    piVar3 = *pCnf->pClauses;
    lVar10 = 0;
    do {
      piVar3[lVar10] = piVar3[lVar10] + local_88 * -2;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pCnf->nLiterals);
  }
  if (local_78->pArray != (int *)0x0) {
    free(local_78->pArray);
  }
  free(local_78);
  return s;
}

Assistant:

sat_solver * Bmc_DeriveSolver( Gia_Man_t * p, Gia_Man_t * pMiter, Cnf_Dat_t * pCnf, int nFramesMax, int nTimeOut, int fVerbose )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj, * pObj0, * pObj1;
    int i, k, iVar0, iVar1, iVarOut;
    int VarShift = 0;

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManRegNum(p) + Gia_ManCoNum(p) + pCnf->nVars * (nFramesMax + 1) );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(Gia_ManRegNum(p) + i, 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // load the last timeframe
    Cnf_DataLiftGia( pCnf, pMiter, Gia_ManRegNum(p) + Gia_ManCoNum(p) );
    VarShift += Gia_ManRegNum(p) + Gia_ManCoNum(p);

    // add XOR clauses
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj0 = Gia_ManPo( pMiter, 2*i+0 );
        pObj1 = Gia_ManPo( pMiter, 2*i+1 );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + i;
        sat_solver_add_xor( pSat, iVar0, iVar1, iVarOut, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
    {
        pObj0 = Gia_ManRi( pMiter, i );
        pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + Gia_ManPoNum(p) + i;
        sat_solver_add_xor_and( pSat, iVarOut, iVar0, iVar1, i );
    }
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add other timeframes
    for ( k = 0; k < nFramesMax; k++ )
    {
        // collect variables of the RO nodes
        Vec_IntClear( vLits );
        Gia_ManForEachRo( pMiter, pObj, i )
            Vec_IntPush( vLits, pCnf->pVarNums[Gia_ObjId(pMiter, pObj)] );
        // lift CNF again
        Cnf_DataLiftGia( pCnf, pMiter, pCnf->nVars );
        VarShift += pCnf->nVars;
        // stitch the clauses
        Gia_ManForEachRi( pMiter, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj)];
            iVar1 = Vec_IntEntry( vLits, i );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // add equality clauses for the COs
        Gia_ManForEachPo( p, pObj, i )
        {
            pObj0 = Gia_ManPo( pMiter, 2*i+0 );
            pObj1 = Gia_ManPo( pMiter, 2*i+1 );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
        {
            pObj0 = Gia_ManRi( pMiter, i );
            pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer_enable( pSat, iVar0, iVar1, i, 0 );
        }
        // add timeframe clauses
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
//    sat_solver_compress( pSat );
    Cnf_DataLiftGia( pCnf, pMiter, -VarShift );
    Vec_IntFree( vLits );
    return pSat;
}